

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeBlockDefinitions(TInfoSink&,glslang::TIntermSymbol*,glslang::
TIntermSymbol*,glslang::TIntermediate*)::TMergeBlockTraverser::visitSymbol(glslang::TIntermSymbol__
          (void *this,TIntermSymbol *symbol)

{
  bool bVar1;
  int iVar2;
  TBlockStorageClass TVar3;
  TBlockStorageClass TVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  undefined4 extraout_var;
  TQualifier *this_00;
  undefined4 extraout_var_00;
  TType *this_01;
  TTypeList *pTVar5;
  undefined4 extraout_var_01;
  TTypeList *this_02;
  TIntermSymbol *symbol_local;
  TMergeBlockTraverser *this_local;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
          (**(code **)(**(long **)((long)this + 0x38) + 0x1a0))();
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  bVar1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    this_00 = (TQualifier *)(**(code **)(**(long **)((long)this + 0x38) + 0x110))();
    TVar3 = TQualifier::getBlockStorage(this_00);
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    TVar4 = TQualifier::getBlockStorage((TQualifier *)CONCAT44(extraout_var_00,iVar2));
    if (TVar3 == TVar4) {
      this_01 = (TType *)(**(code **)(**(long **)((long)this + 0x38) + 0xf0))();
      pTVar5 = TType::getStruct(this_01);
      iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      this_02 = TType::getWritableStruct((TType *)CONCAT44(extraout_var_01,iVar2));
      TVector<glslang::TTypeLoc>::operator=(this_02,pTVar5);
    }
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
        {
            if (newSymbol->getAccessName() == symbol->getAccessName() &&
                newSymbol->getQualifier().getBlockStorage() == symbol->getQualifier().getBlockStorage()) {
                // Each symbol node may have a local copy of the block structure.
                // Update those structures to match the new one post-merge
                *(symbol->getWritableType().getWritableStruct()) = *(newSymbol->getType().getStruct());
            }
        }